

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O1

int __thiscall smf::Binasc::outputStyleAscii(Binasc *this,ostream *out,istream *input)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  size_t sVar6;
  ostream *poVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  uchar outputWord [256];
  char local_159;
  ostream *local_158;
  ulong local_150;
  istream *local_148;
  Binasc *local_140;
  byte local_138 [264];
  
  uVar10 = 0;
  local_140 = this;
  memset(local_138,0,0x100);
  bVar4 = std::istream::get();
  if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0) {
    local_150 = 0;
    local_158 = out;
    local_148 = input;
    bVar3 = false;
    do {
      iVar5 = isprint((uint)bVar4);
      if (iVar5 == 0) {
        bVar12 = false;
      }
      else {
        iVar5 = isspace((uint)bVar4);
        bVar12 = iVar5 == 0;
      }
      iVar5 = (int)uVar10;
      if (!bVar3 && bVar12) {
        iVar1 = (int)local_150;
        iVar11 = local_140->m_maxLineLength;
        local_138[iVar5] = 0;
        if (iVar5 + iVar1 < iVar11) {
          iVar11 = 0;
          if (iVar1 != 0) {
            local_159 = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(local_158,&local_159,1);
            iVar11 = iVar1 + 1;
          }
          sVar6 = strlen((char *)local_138);
          std::__ostream_insert<char,std::char_traits<char>>(local_158,(char *)local_138,sVar6);
          local_150 = (ulong)(uint)(iVar11 + iVar5);
        }
        else {
          local_159 = '\n';
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>(local_158,&local_159,1);
          sVar6 = strlen((char *)local_138);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_138,sVar6);
          local_150 = uVar10;
        }
        uVar10 = 0;
        input = local_148;
      }
      uVar9 = (uint)uVar10;
      if (bVar12) {
        lVar8 = (long)(int)uVar9;
        uVar9 = uVar9 + 1;
        local_138[lVar8] = bVar4;
      }
      uVar10 = (ulong)uVar9;
      bVar4 = std::istream::get();
      bVar3 = bVar12;
    } while (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0);
    if (uVar9 != 0) {
      cVar2 = (char)local_158;
      std::ios::widen((char)*(undefined8 *)(*(long *)local_158 + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
    }
  }
  return 1;
}

Assistant:

int Binasc::outputStyleAscii(std::ostream& out, std::istream& input) {
	uchar outputWord[256] = {0};   // storage for current word
	int index     = 0;             // current length of word
	int lineCount = 0;             // current length of line
	int type      = 0;             // 0=space, 1=printable
	uchar ch;                      // current input byte

	ch = static_cast<uchar>(input.get());
	while (!input.eof()) {
		int lastType = type;
		type = (isprint(ch) && !isspace(ch)) ? 1 : 0;

		if ((type == 1) && (lastType == 0)) {
			// start of a new word.  check where to put old word
			if (index + lineCount >= m_maxLineLength) {  // put on next line
				outputWord[index] = '\0';
				out << '\n' << outputWord;
				lineCount = index;
				index = 0;
			} else {                                   // put on current line
				outputWord[index] = '\0';
				if (lineCount != 0) {
					out << ' ';
					lineCount++;
				}
				out << outputWord;
				lineCount += index;
				index = 0;
			}
		}
		if (type == 1) {
			outputWord[index++] = ch;
		}
		ch = static_cast<uchar>(input.get());
	}

	if (index != 0) {
		out << std::endl;
	}

	return 1;
}